

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_machoread.c
# Opt level: O0

int load_macho_header32(dwarf_macho_object_access_internals_t *mfp,int *errcode)

{
  Dwarf_Unsigned inner;
  int res;
  mach_header mh32;
  int *errcode_local;
  dwarf_macho_object_access_internals_t *mfp_local;
  
  inner._0_4_ = 0;
  if (mfp->mo_filesize < 0x1c) {
    *errcode = 0x1a7;
    mfp_local._4_4_ = 1;
  }
  else {
    mh32._20_8_ = errcode;
    inner._0_4_ = _dwarf_object_read_random
                            (mfp->mo_fd,(char *)((long)&inner + 4),mfp->mo_inner_offset,0x1c,
                             mfp->mo_inner_offset + mfp->mo_filesize,errcode);
    mfp_local._4_4_ = (int)inner;
    if ((int)inner == 0) {
      (mfp->mo_header).magic = 0;
      *(undefined4 *)&(mfp->mo_header).magic = inner._4_4_;
      (mfp->mo_header).cputype = 0;
      (*mfp->mo_copy_word)(&(mfp->mo_header).cputype,&res,4);
      (mfp->mo_header).cpusubtype = 0;
      (*mfp->mo_copy_word)(&(mfp->mo_header).cpusubtype,&mh32,4);
      (mfp->mo_header).filetype = 0;
      (*mfp->mo_copy_word)(&(mfp->mo_header).filetype,mh32.cputype,4);
      (mfp->mo_header).ncmds = 0;
      (*mfp->mo_copy_word)(&(mfp->mo_header).ncmds,mh32.cpusubtype,4);
      (mfp->mo_header).sizeofcmds = 0;
      (*mfp->mo_copy_word)(&(mfp->mo_header).sizeofcmds,mh32.filetype,4);
      (mfp->mo_header).flags = 0;
      (*mfp->mo_copy_word)(&(mfp->mo_header).flags,mh32.ncmds,4);
      (mfp->mo_header).reserved = 0;
      mfp->mo_command_count = (uint)(mfp->mo_header).ncmds;
      if ((((ulong)mfp->mo_command_count < mfp->mo_filesize) &&
          ((mfp->mo_header).sizeofcmds < mfp->mo_filesize)) &&
         ((ulong)mfp->mo_command_count < (mfp->mo_header).sizeofcmds)) {
        mfp->mo_machine = (mfp->mo_header).cputype;
        mfp->mo_flags = (mfp->mo_header).flags;
        mfp->mo_command_start_offset = 0x1c;
        mfp_local._4_4_ = 0;
      }
      else {
        *(undefined4 *)mh32._20_8_ = 0x1e6;
        mfp_local._4_4_ = 1;
      }
    }
  }
  return mfp_local._4_4_;
}

Assistant:

static int
load_macho_header32(dwarf_macho_object_access_internals_t *mfp,
    int *errcode)
{
    struct mach_header mh32;
    int res = 0;
    Dwarf_Unsigned inner = mfp->mo_inner_offset;

    if (sizeof(mh32) > mfp->mo_filesize) {
        *errcode = DW_DLE_FILE_TOO_SMALL;
        return DW_DLV_ERROR;
    }
    res = RRMOA(mfp->mo_fd, &mh32, inner, sizeof(mh32),
        (inner+mfp->mo_filesize), errcode);
    if (res != DW_DLV_OK) {
        return res;
    }
    /* Do not adjust endianness of magic, leave as-is. */
    ASNAR(memcpy,mfp->mo_header.magic,mh32.magic);
    ASNAR(mfp->mo_copy_word,mfp->mo_header.cputype,mh32.cputype);
    ASNAR(mfp->mo_copy_word,mfp->mo_header.cpusubtype,
        mh32.cpusubtype);
    ASNAR(mfp->mo_copy_word,mfp->mo_header.filetype,mh32.filetype);
    ASNAR(mfp->mo_copy_word,mfp->mo_header.ncmds,mh32.ncmds);
    ASNAR(mfp->mo_copy_word,mfp->mo_header.sizeofcmds,
        mh32.sizeofcmds);
    ASNAR(mfp->mo_copy_word,mfp->mo_header.flags,mh32.flags);
    mfp->mo_header.reserved = 0;
    mfp->mo_command_count = (unsigned int)mfp->mo_header.ncmds;
    if (mfp->mo_command_count >= mfp->mo_filesize ||
        mfp->mo_header.sizeofcmds >= mfp->mo_filesize ||
        mfp->mo_command_count >= mfp->mo_header.sizeofcmds) {
        *errcode = DW_DLE_MACHO_CORRUPT_HEADER;
        return DW_DLV_ERROR;
    }
    mfp->mo_machine = mfp->mo_header.cputype;
    mfp->mo_flags = mfp->mo_header.flags;
    mfp->mo_command_start_offset = sizeof(mh32);
    return DW_DLV_OK;
}